

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O3

optional<uuids::uuid> *
uuids::uuid::from_string<char[3]>(optional<uuids::uuid> *__return_storage_ptr__,char (*in_str) [3])

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  array<unsigned_char,_16UL> data;
  undefined8 local_28;
  undefined8 uStack_20;
  
  sVar3 = strlen(*in_str);
  local_28 = 0;
  uStack_20 = 0;
  if ((sVar3 != 0) && ((bVar10 = (*in_str)[0] == '{', !bVar10 || (in_str[-1][sVar3 + 2] == '}')))) {
    uVar4 = (ulong)bVar10;
    bVar9 = false;
    if (sVar3 - uVar4 <= uVar4) goto LAB_00172c22;
    bVar2 = true;
    lVar6 = 0;
    uVar5 = 0;
    do {
      bVar1 = (*in_str)[lVar6 + uVar4];
      if (bVar1 != 0x2d) {
        if (0xf < uVar5) goto LAB_00172c1f;
        bVar7 = bVar1 - 0x30;
        if (bVar7 < 10) {
          if (bVar2) {
LAB_00172bdf:
            *(byte *)((long)&local_28 + uVar5) = bVar7 << 4;
            bVar2 = false;
            goto LAB_00172c0d;
          }
          bVar8 = *(byte *)((long)&local_28 + uVar5);
        }
        else {
          bVar9 = false;
          if ((0x25 < bVar1 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0))
          goto LAB_00172c22;
          if (bVar2) {
            if (9 < bVar7) {
              if ((byte)(bVar1 + 0x9f) < 6) {
                bVar7 = bVar1 + 0xa9;
              }
              else {
                bVar7 = bVar1 - 0x37;
                if (5 < (byte)(bVar1 + 0xbf)) {
                  bVar7 = 0;
                }
              }
            }
            goto LAB_00172bdf;
          }
          bVar8 = *(byte *)((long)&local_28 + uVar5);
          if (9 < bVar7) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar7 = bVar1 + 0xa9;
            }
            else {
              bVar7 = bVar1 - 0x37;
              if (5 < (byte)(bVar1 + 0xbf)) {
                bVar7 = 0;
              }
            }
          }
        }
        *(byte *)((long)&local_28 + uVar5) = bVar8 | bVar7;
        uVar5 = uVar5 + 1;
        bVar2 = true;
      }
LAB_00172c0d:
      lVar6 = lVar6 + 1;
    } while (sVar3 - (uint)bVar10 * 2 != lVar6);
    if (0xf < uVar5) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
        super__Optional_payload_base<uuids::uuid>._M_payload = local_28;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
               super__Optional_payload_base<uuids::uuid>._M_payload + 8) = uStack_20;
      bVar9 = true;
      goto LAB_00172c22;
    }
  }
LAB_00172c1f:
  bVar9 = false;
LAB_00172c22:
  (__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
  super__Optional_payload_base<uuids::uuid>._M_engaged = bVar9;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr static std::optional<uuid> from_string(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         std::array<uint8_t, 16> data{ { 0 } };

         if (str.empty()) return {};

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return {};

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return {};
            }

            if (firstDigit)
            {
               data[index] = static_cast<uint8_t>(detail::hex2char(str[i]) << 4);
               firstDigit = false;
            }
            else
            {
               data[index] = static_cast<uint8_t>(data[index] | detail::hex2char(str[i]));
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return {};
         }

         return uuid{ data };
      }